

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O2

void __thiscall FIX::FileStore::~FileStore(FileStore *this)

{
  (this->super_MessageStore)._vptr_MessageStore = (_func_int **)&PTR__FileStore_001eee60;
  if ((FILE *)this->m_msgFile != (FILE *)0x0) {
    fclose((FILE *)this->m_msgFile);
  }
  if ((FILE *)this->m_headerFile != (FILE *)0x0) {
    fclose((FILE *)this->m_headerFile);
  }
  if ((FILE *)this->m_seqNumsFile != (FILE *)0x0) {
    fclose((FILE *)this->m_seqNumsFile);
  }
  if ((FILE *)this->m_sessionFile != (FILE *)0x0) {
    fclose((FILE *)this->m_sessionFile);
  }
  std::__cxx11::string::~string((string *)&this->m_sessionFileName);
  std::__cxx11::string::~string((string *)&this->m_seqNumsFileName);
  std::__cxx11::string::~string((string *)&this->m_headerFileName);
  std::__cxx11::string::~string((string *)&this->m_msgFileName);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<long,_unsigned_long>_>,_std::_Select1st<std::pair<const_int,_std::pair<long,_unsigned_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<long,_unsigned_long>_>_>_>
  ::~_Rb_tree(&(this->m_offsets)._M_t);
  MemoryStore::~MemoryStore(&this->m_cache);
  return;
}

Assistant:

FileStore::~FileStore()
{
  if( m_msgFile ) fclose( m_msgFile );
  if( m_headerFile ) fclose( m_headerFile );
  if( m_seqNumsFile ) fclose( m_seqNumsFile );
  if( m_sessionFile ) fclose( m_sessionFile );
}